

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

ConfigUseClauseSyntax * __thiscall slang::parsing::Parser::parseConfigUseClause(Parser *this)

{
  Token use_00;
  SourceRange range;
  SourceRange range_00;
  Token colon_00;
  Token config_00;
  bool bVar1;
  ParameterValueAssignmentSyntax *pPVar2;
  ParamAssignmentSyntax *pPVar3;
  ConfigUseClauseSyntax *pCVar4;
  SourceLocation in_RDI;
  Token TVar5;
  Parser *in_stack_00000008;
  Token config;
  Token colon;
  ParameterValueAssignmentSyntax *paramAssignments;
  ConfigCellIdentifierSyntax *name;
  Token use;
  size_t in_stack_ffffffffffffff08;
  SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax> *in_stack_ffffffffffffff10;
  TokenKind in_stack_ffffffffffffff1e;
  ParserBase *in_stack_ffffffffffffff20;
  ParserBase *in_stack_ffffffffffffff28;
  SourceLocation in_stack_ffffffffffffff38;
  DiagCode in_stack_ffffffffffffff44;
  SyntaxNode *in_stack_ffffffffffffff60;
  ParserBase *local_80;
  Parser *local_78;
  ConfigCellIdentifierSyntax *local_70;
  TokenKind kind;
  ParserBase *in_stack_ffffffffffffffa0;
  Parser *in_stack_ffffffffffffffa8;
  ConfigCellIdentifierSyntax *local_50;
  Info *local_48;
  ConfigCellIdentifierSyntax *local_20;
  
  ParserBase::expect(in_stack_ffffffffffffffa0,kind);
  local_20 = (ConfigCellIdentifierSyntax *)0x0;
  bVar1 = ParserBase::peek(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1e);
  local_80 = in_stack_ffffffffffffffa0;
  local_78 = in_stack_ffffffffffffffa8;
  if ((bVar1) ||
     (bVar1 = ParserBase::peek(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1e),
     local_80 = in_stack_ffffffffffffffa0, local_78 = in_stack_ffffffffffffffa8, !bVar1)) {
    local_20 = parseConfigCellIdentifier(local_78);
  }
  pPVar2 = parseParameterValueAssignment(in_stack_00000008);
  if (((pPVar2 != (ParameterValueAssignmentSyntax *)0x0) &&
      (bVar1 = slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::empty
                         ((SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax> *)0x32158c),
      !bVar1)) &&
     (pPVar3 = slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::operator[]
                         (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08),
     (pPVar3->super_SyntaxNode).kind == OrderedParamAssignment)) {
    slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::operator[]
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffff60);
    range.endLoc = in_stack_ffffffffffffff38;
    range.startLoc = in_RDI;
    ParserBase::addDiag(in_stack_ffffffffffffff28,in_stack_ffffffffffffff44,range);
  }
  Token::Token((Token *)in_stack_ffffffffffffff10);
  Token::Token((Token *)in_stack_ffffffffffffff10);
  bVar1 = ParserBase::peek(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1e);
  if (bVar1) {
    TVar5 = ParserBase::consume((ParserBase *)in_RDI);
    local_70 = TVar5._0_8_;
    local_50 = local_70;
    local_48 = TVar5.info;
    kind = TVar5.info._6_2_;
    TVar5 = ParserBase::expect(local_80,kind);
    local_80 = TVar5._0_8_;
    local_78 = (Parser *)TVar5.info;
    if ((local_20 == (ConfigCellIdentifierSyntax *)0x0) &&
       (bVar1 = Token::isMissing((Token *)&stack0xffffffffffffffa0), !bVar1)) {
      Token::range((Token *)in_RDI);
      range_00.endLoc = in_stack_ffffffffffffff38;
      range_00.startLoc = in_RDI;
      ParserBase::addDiag(in_stack_ffffffffffffff28,in_stack_ffffffffffffff44,range_00);
    }
  }
  use_00.info = (Info *)local_78;
  use_00._0_8_ = local_80;
  colon_00.info = (Info *)local_80;
  colon_00._0_8_ = in_RDI;
  config_00.info = (Info *)local_50;
  config_00._0_8_ = local_78;
  pCVar4 = slang::syntax::SyntaxFactory::configUseClause
                     ((SyntaxFactory *)local_48,use_00,local_50,
                      (ParameterValueAssignmentSyntax *)0x3217a8,colon_00,config_00);
  return pCVar4;
}

Assistant:

ConfigUseClauseSyntax& Parser::parseConfigUseClause() {
    auto use = expect(TokenKind::UseKeyword);

    ConfigCellIdentifierSyntax* name = nullptr;
    if (peek(TokenKind::Identifier) || !peek(TokenKind::Hash))
        name = &parseConfigCellIdentifier();

    auto paramAssignments = parseParameterValueAssignment();
    if (paramAssignments && !paramAssignments->parameters.empty() &&
        paramAssignments->parameters[0]->kind == SyntaxKind::OrderedParamAssignment) {
        addDiag(diag::ConfigParamsOrdered, paramAssignments->parameters[0]->sourceRange());
    }

    Token colon, config;
    if (peek(TokenKind::Colon)) {
        colon = consume();
        config = expect(TokenKind::ConfigKeyword);

        if (!name && !config.isMissing())
            addDiag(diag::ConfigMissingName, config.range());
    }

    return factory.configUseClause(use, name, paramAssignments, colon, config);
}